

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsInput
helicsFederateRegisterGlobalInput
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  int iVar1;
  pointer pcVar2;
  size_type sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar4;
  string_view units_00;
  ulong uVar5;
  ValueFederate *pVVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Head_base<0UL,_helics::InputObject_*,_false> _Var8;
  string *psVar9;
  Input *pIVar10;
  ulong uVar11;
  const_iterator __position;
  _Alloc_hider _Var12;
  FedObject *fedObj;
  string_view name;
  string_view type_00;
  __single_object inp;
  __uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_> local_78;
  _Head_base<0UL,_helics::InputObject_*,_false> local_70;
  HelicsError *local_68;
  size_type local_60;
  ValueFederate *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  size_t local_40;
  char *pcStack_38;
  
  local_68 = err;
  getValueFedSharedPtr(&local_58,(HelicsError *)fed);
  pVVar6 = local_58;
  if (local_58 != (ValueFederate *)0x0) {
    if ((((uint)type < 10) || (type == HELICS_DATA_TYPE_ANY)) || (type == HELICS_DATA_TYPE_JSON)) {
      local_70._M_head_impl = (InputObject *)operator_new(0x20);
      ((local_70._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_70._M_head_impl)->inputPtr = (Input *)0x0;
      *(undefined8 *)local_70._M_head_impl = 0;
      ((local_70._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_60 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var12 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (key != (char *)0x0) {
        local_60 = strlen(key);
        _Var12._M_p = key;
      }
      psVar9 = helics::typeNameStringRef_abi_cxx11_(type);
      pcVar2 = (psVar9->_M_dataplus)._M_p;
      sVar3 = psVar9->_M_string_length;
      local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      pcStack_38 = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (units != (char *)0x0) {
        local_40 = strlen(units);
        pcStack_38 = units;
      }
      units_00._M_str = pcStack_38;
      units_00._M_len = local_40;
      name._M_str = _Var12._M_p;
      name._M_len = local_60;
      type_00._M_str = pcVar2;
      type_00._M_len = sVar3;
      pIVar10 = helics::ValueFederate::registerGlobalInput(pVVar6,name,type_00,units_00);
      p_Var7 = p_Stack_50;
      pVVar6 = local_58;
      (local_70._M_head_impl)->inputPtr = pIVar10;
      local_58 = (ValueFederate *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = ((local_70._M_head_impl)->fedptr).
             super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      ((local_70._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pVVar6;
      ((local_70._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var7;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      _Var8._M_head_impl = local_70._M_head_impl;
      local_78._M_t.
      super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
      super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
           (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
           (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
           local_70._M_head_impl;
      local_70._M_head_impl = (InputObject *)0x0;
      (_Var8._M_head_impl)->valid = 0x3456e052;
      __position._M_current =
           *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
            ((long)fed + 0x50);
      puVar4 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
                ((long)fed + 0x58);
      if ((__position._M_current == puVar4) ||
         (iVar1 = ((_Var8._M_head_impl)->inputPtr->super_Interface).handle.hid,
         ((puVar4[-1]._M_t.
           super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>.
           _M_t.
           super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
           super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
         super_Interface).handle.hid < iVar1)) {
        std::
        vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
        ::
        emplace_back<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>
                  ((vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
                    *)((long)fed + 0x50),
                   (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                   &local_78);
      }
      else {
        uVar11 = (long)puVar4 - (long)__position._M_current >> 3;
        while (uVar5 = uVar11, 0 < (long)uVar5) {
          uVar11 = uVar5 >> 1;
          if (((__position._M_current[uVar11]._M_t.
                super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
                .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
              super_Interface).handle.hid <= iVar1) {
            __position._M_current = __position._M_current + uVar11 + 1;
            uVar11 = ~uVar11 + uVar5;
          }
        }
        std::
        vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
        ::_M_insert_rval((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
                          *)((long)fed + 0x50),__position,(value_type *)&local_78);
      }
      if (local_78._M_t.
          super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
          super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>)0x0) {
        std::default_delete<helics::InputObject>::operator()
                  ((default_delete<helics::InputObject> *)&local_78,
                   (InputObject *)
                   local_78._M_t.
                   super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
                   .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl);
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
      super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
           (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
           (_Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>)0x0;
      if (local_70._M_head_impl != (InputObject *)0x0) {
        std::default_delete<helics::InputObject>::operator()
                  ((default_delete<helics::InputObject> *)&local_70,local_70._M_head_impl);
      }
      goto LAB_001a79cc;
    }
    if (type == HELICS_DATA_TYPE_RAW) {
      _Var8._M_head_impl =
           (InputObject *)helicsFederateRegisterGlobalTypeInput(fed,key,"raw",units,local_68);
      goto LAB_001a79cc;
    }
    if (local_68 != (HelicsError *)0x0) {
      local_68->error_code = -4;
      local_68->message = "unrecognized type code";
    }
  }
  _Var8._M_head_impl = (InputObject *)0x0;
LAB_001a79cc:
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return _Var8._M_head_impl;
}

Assistant:

HelicsInput
    helicsFederateRegisterGlobalInput(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterGlobalTypeInput(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_ANY && type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }

    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerGlobalInput(AS_STRING_VIEW(key),
                                                      helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                      AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}